

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O3

int h262_infer_vectors(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,
                      h262_macroblock *mb,int s)

{
  int iVar1;
  uint ival;
  long lVar2;
  
  if (picparm->picture_structure != 3) {
    ival = (uint)(picparm->picture_structure == 2);
    iVar1 = vs_infer(str,mb->motion_vertical_field_select[s],ival);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,mb->motion_vertical_field_select[s] + 1,ival);
    if (iVar1 != 0) {
      return 1;
    }
  }
  lVar2 = (long)s;
  iVar1 = vs_infer(str,mb->motion_code[0][lVar2],0);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = vs_infer(str,mb->motion_code[0][lVar2] + 1,0);
  if ((((iVar1 == 0) && (iVar1 = vs_infer(str,mb->motion_code[1][lVar2],0), iVar1 == 0)) &&
      (iVar1 = vs_infer(str,mb->motion_residual[-1][lVar2] + 1,0), iVar1 == 0)) &&
     (((iVar1 = vs_infer(str,mb->motion_residual[0][lVar2],0), iVar1 == 0 &&
       (iVar1 = vs_infer(str,mb->motion_residual[0][lVar2] + 1,0), iVar1 == 0)) &&
      ((iVar1 = vs_infer(str,mb->motion_residual[1][lVar2],0), iVar1 == 0 &&
       (iVar1 = vs_infer(str,mb->dmvector + lVar2 * 2 + -3,0), iVar1 == 0)))))) {
    if (s == 0) {
      iVar1 = vs_infer(str,mb->dmvector,0);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infer(str,mb->dmvector + 1,0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    return 0;
  }
  return 1;
}

Assistant:

int h262_infer_vectors(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int s) {
	if (picparm->picture_structure != H262_PIC_STRUCT_FRAME) {
		int bottom = picparm->picture_structure == H262_PIC_STRUCT_FIELD_BOTTOM;
		if (vs_infer(str, &mb->motion_vertical_field_select[s][0], bottom)) return 1;
		if (vs_infer(str, &mb->motion_vertical_field_select[s][1], bottom)) return 1;
	}
	if (vs_infer(str, &mb->motion_code[0][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[0][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[1][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[1][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[0][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[0][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[1][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[1][s][1], 0)) return 1;
	if (!s) {
		if (vs_infer(str, &mb->dmvector[0], 0)) return 1;
		if (vs_infer(str, &mb->dmvector[1], 0)) return 1;
	}
	return 0;
}